

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::SymbolicallyPerturbedSign
              (Vector3_xf *a,Vector3_xf *b,Vector3_xf *c,Vector3_xf *b_cross_c)

{
  ExactFloat *pEVar1;
  ExactFloat *b_00;
  int32 iVar2;
  ExactFloat *b_01;
  bool bVar3;
  int32 iVar4;
  ExactFloat *bp_1;
  int iVar5;
  ExactFloat *bp;
  ExactFloat local_d8;
  ExactFloat local_c8;
  ExactFloat local_b8;
  ExactFloat local_a8;
  ExactFloat local_98;
  ExactFloat local_88;
  ExactFloat local_78;
  ExactFloat *local_68;
  ExactFloat *local_60;
  ExactFloat *local_58;
  S2LogMessage local_50;
  S2LogMessage local_40;
  
  local_68 = a->c_;
  bVar3 = std::
          __lexicographical_compare_impl<ExactFloat_const*,ExactFloat_const*,__gnu_cxx::__ops::_Iter_less_iter>
                    (a,a + 1,b,b + 1);
  if (bVar3) {
    bVar3 = std::
            __lexicographical_compare_impl<ExactFloat_const*,ExactFloat_const*,__gnu_cxx::__ops::_Iter_less_iter>
                      (b,b + 1,c,c + 1);
    bVar3 = !bVar3;
  }
  else {
    bVar3 = true;
  }
  if (bVar3) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x8c,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: a < b && b < c ",0x1d);
    if (bVar3) goto LAB_0018a0bc;
  }
  ExactFloat::ExactFloat(&local_d8,b_cross_c->c_ + 2);
  iVar2 = local_d8.bn_exp_;
  iVar4 = local_d8.sign_;
  BN_free((BIGNUM *)local_d8.bn_.bn_);
  if ((iVar2 & 0xfffffffdU) == 0x7ffffffd) {
    iVar4 = 0;
  }
  if (iVar4 == 0) {
    ExactFloat::ExactFloat(&local_d8,b_cross_c->c_ + 1);
    iVar2 = local_d8.bn_exp_;
    iVar4 = local_d8.sign_;
    BN_free((BIGNUM *)local_d8.bn_.bn_);
    if ((iVar2 & 0xfffffffdU) == 0x7ffffffd) {
      iVar4 = 0;
    }
    if (iVar4 == 0) {
      ExactFloat::ExactFloat(&local_d8,b_cross_c->c_);
      iVar2 = local_d8.bn_exp_;
      iVar4 = local_d8.sign_;
      BN_free((BIGNUM *)local_d8.bn_.bn_);
      if ((iVar2 & 0xfffffffdU) == 0x7ffffffd) {
        iVar4 = 0;
      }
      if (iVar4 == 0) {
        ExactFloat::ExactFloat(&local_88,c->c_);
        pEVar1 = local_68 + 1;
        ExactFloat::ExactFloat(&local_98,pEVar1);
        operator*(&local_78,&local_88);
        local_60 = c->c_ + 1;
        ExactFloat::ExactFloat(&local_b8,local_60);
        ExactFloat::ExactFloat(&local_c8,local_68);
        operator*(&local_a8,&local_b8);
        operator-(&local_d8,&local_78);
        iVar4 = 0;
        if ((local_d8.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
          iVar4 = local_d8.sign_;
        }
        BN_free((BIGNUM *)local_d8.bn_.bn_);
        BN_free((BIGNUM *)local_a8.bn_.bn_);
        BN_free((BIGNUM *)local_c8.bn_.bn_);
        BN_free((BIGNUM *)local_b8.bn_.bn_);
        BN_free((BIGNUM *)local_78.bn_.bn_);
        BN_free((BIGNUM *)local_98.bn_.bn_);
        BN_free((BIGNUM *)local_88.bn_.bn_);
        if (iVar4 == 0) {
          local_58 = pEVar1;
          ExactFloat::ExactFloat(&local_d8,c->c_);
          iVar2 = local_d8.bn_exp_;
          iVar4 = local_d8.sign_;
          BN_free((BIGNUM *)local_d8.bn_.bn_);
          if ((iVar2 & 0xfffffffdU) == 0x7ffffffd) {
            iVar4 = 0;
          }
          if (iVar4 == 0) {
            ExactFloat::ExactFloat(&local_d8,local_60);
            iVar5 = 0;
            if ((local_d8.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
              iVar5 = local_d8.sign_;
            }
            BN_free((BIGNUM *)local_d8.bn_.bn_);
            if (iVar5 == 0) {
              b_00 = c->c_ + 2;
              ExactFloat::ExactFloat(&local_88,b_00);
              ExactFloat::ExactFloat(&local_98,local_68);
              operator*(&local_78,&local_88);
              ExactFloat::ExactFloat(&local_b8,c->c_);
              pEVar1 = local_68 + 2;
              ExactFloat::ExactFloat(&local_c8,pEVar1);
              operator*(&local_a8,&local_b8);
              operator-(&local_d8,&local_78);
              iVar4 = 0;
              if ((local_d8.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
                iVar4 = local_d8.sign_;
              }
              BN_free((BIGNUM *)local_d8.bn_.bn_);
              BN_free((BIGNUM *)local_a8.bn_.bn_);
              BN_free((BIGNUM *)local_c8.bn_.bn_);
              BN_free((BIGNUM *)local_b8.bn_.bn_);
              BN_free((BIGNUM *)local_78.bn_.bn_);
              BN_free((BIGNUM *)local_98.bn_.bn_);
              BN_free((BIGNUM *)local_88.bn_.bn_);
              if (iVar4 == 0) {
                ExactFloat::ExactFloat(&local_d8,b_00);
                iVar2 = local_d8.bn_exp_;
                iVar4 = local_d8.sign_;
                BN_free((BIGNUM *)local_d8.bn_.bn_);
                b_01 = local_58;
                if ((iVar2 & 0xfffffffdU) == 0x7ffffffd) {
                  iVar4 = 0;
                }
                if (iVar4 == 0) {
                  ExactFloat::ExactFloat(&local_88,local_60);
                  ExactFloat::ExactFloat(&local_98,pEVar1);
                  operator*(&local_78,&local_88);
                  ExactFloat::ExactFloat(&local_b8,b_00);
                  ExactFloat::ExactFloat(&local_c8,b_01);
                  operator*(&local_a8,&local_b8);
                  operator-(&local_d8,&local_78);
                  if (((local_d8.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) && (local_d8.sign_ != 0)) {
                    S2LogMessage::S2LogMessage
                              (&local_50,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                               ,0xd0,kFatal,(ostream *)&std::cerr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_50.stream_,
                               "Check failed: (0) == ((c[1]*a[2] - c[2]*a[1]).sgn()) ",0x35);
LAB_0018a0bc:
                    abort();
                  }
                  BN_free((BIGNUM *)local_d8.bn_.bn_);
                  BN_free((BIGNUM *)local_a8.bn_.bn_);
                  BN_free((BIGNUM *)local_c8.bn_.bn_);
                  BN_free((BIGNUM *)local_b8.bn_.bn_);
                  BN_free((BIGNUM *)local_78.bn_.bn_);
                  BN_free((BIGNUM *)local_98.bn_.bn_);
                  BN_free((BIGNUM *)local_88.bn_.bn_);
                  ExactFloat::ExactFloat(&local_88,local_68);
                  ExactFloat::ExactFloat(&local_98,b->c_ + 1);
                  operator*(&local_78,&local_88);
                  ExactFloat::ExactFloat(&local_b8,b_01);
                  ExactFloat::ExactFloat(&local_c8,b->c_);
                  operator*(&local_a8,&local_b8);
                  operator-(&local_d8,&local_78);
                  iVar4 = 0;
                  if ((local_d8.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
                    iVar4 = local_d8.sign_;
                  }
                  BN_free((BIGNUM *)local_d8.bn_.bn_);
                  BN_free((BIGNUM *)local_a8.bn_.bn_);
                  BN_free((BIGNUM *)local_c8.bn_.bn_);
                  BN_free((BIGNUM *)local_b8.bn_.bn_);
                  BN_free((BIGNUM *)local_78.bn_.bn_);
                  BN_free((BIGNUM *)local_98.bn_.bn_);
                  BN_free((BIGNUM *)local_88.bn_.bn_);
                  if (iVar4 == 0) {
                    ExactFloat::ExactFloat(&local_d8,b->c_);
                    iVar5 = 0;
                    if ((local_d8.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
                      iVar5 = local_d8.sign_;
                    }
                    BN_free((BIGNUM *)local_d8.bn_.bn_);
                    if (iVar5 == 0) {
                      ExactFloat::ExactFloat(&local_d8,b->c_ + 1);
                      iVar2 = local_d8.bn_exp_;
                      iVar4 = local_d8.sign_;
                      BN_free((BIGNUM *)local_d8.bn_.bn_);
                      if ((iVar2 & 0xfffffffdU) == 0x7ffffffd) {
                        iVar4 = 0;
                      }
                      if (iVar4 == 0) {
                        ExactFloat::ExactFloat(&local_d8,local_68);
                        BN_free((BIGNUM *)local_d8.bn_.bn_);
                        iVar4 = 1;
                        if ((local_d8.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
                          iVar4 = local_d8.sign_ + (uint)(local_d8.sign_ == 0);
                        }
                      }
                    }
                    else {
                      iVar4 = -iVar5;
                    }
                  }
                }
              }
            }
            else {
              iVar4 = -iVar5;
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int SymbolicallyPerturbedSign(
    const Vector3_xf& a, const Vector3_xf& b,
    const Vector3_xf& c, const Vector3_xf& b_cross_c) {
  // This method requires that the points are sorted in lexicographically
  // increasing order.  This is because every possible S2Point has its own
  // symbolic perturbation such that if A < B then the symbolic perturbation
  // for A is much larger than the perturbation for B.
  //
  // Alternatively, we could sort the points in this method and keep track of
  // the sign of the permutation, but it is more efficient to do this before
  // converting the inputs to the multi-precision representation, and this
  // also lets us re-use the result of the cross product B x C.
  S2_DCHECK(a < b && b < c);

  // Every input coordinate x[i] is assigned a symbolic perturbation dx[i].
  // We then compute the sign of the determinant of the perturbed points,
  // i.e.
  //               | a[0]+da[0]  a[1]+da[1]  a[2]+da[2] |
  //               | b[0]+db[0]  b[1]+db[1]  b[2]+db[2] |
  //               | c[0]+dc[0]  c[1]+dc[1]  c[2]+dc[2] |
  //
  // The perturbations are chosen such that
  //
  //   da[2] > da[1] > da[0] > db[2] > db[1] > db[0] > dc[2] > dc[1] > dc[0]
  //
  // where each perturbation is so much smaller than the previous one that we
  // don't even need to consider it unless the coefficients of all previous
  // perturbations are zero.  In fact, it is so small that we don't need to
  // consider it unless the coefficient of all products of the previous
  // perturbations are zero.  For example, we don't need to consider the
  // coefficient of db[1] unless the coefficient of db[2]*da[0] is zero.
  //
  // The follow code simply enumerates the coefficients of the perturbations
  // (and products of perturbations) that appear in the determinant above, in
  // order of decreasing perturbation magnitude.  The first non-zero
  // coefficient determines the sign of the result.  The easiest way to
  // enumerate the coefficients in the correct order is to pretend that each
  // perturbation is some tiny value "eps" raised to a power of two:
  //
  // eps**    1      2      4      8     16     32     64     128    256
  //        da[2]  da[1]  da[0]  db[2]  db[1]  db[0]  dc[2]  dc[1]  dc[0]
  //
  // Essentially we can then just count in binary and test the corresponding
  // subset of perturbations at each step.  So for example, we must test the
  // coefficient of db[2]*da[0] before db[1] because eps**12 > eps**16.
  //
  // Of course, not all products of these perturbations appear in the
  // determinant above, since the determinant only contains the products of
  // elements in distinct rows and columns.  Thus we don't need to consider
  // da[2]*da[1], db[1]*da[1], etc.  Furthermore, sometimes different pairs of
  // perturbations have the same coefficient in the determinant; for example,
  // da[1]*db[0] and db[1]*da[0] have the same coefficient (c[2]).  Therefore
  // we only need to test this coefficient the first time we encounter it in
  // the binary order above (which will be db[1]*da[0]).
  //
  // The sequence of tests below also appears in Table 4-ii of the paper
  // referenced above, if you just want to look it up, with the following
  // translations: [a,b,c] -> [i,j,k] and [0,1,2] -> [1,2,3].  Also note that
  // some of the signs are different because the opposite cross product is
  // used (e.g., B x C rather than C x B).

  int det_sign = b_cross_c[2].sgn();            // da[2]
  if (det_sign != 0) return det_sign;
  det_sign = b_cross_c[1].sgn();                // da[1]
  if (det_sign != 0) return det_sign;
  det_sign = b_cross_c[0].sgn();                // da[0]
  if (det_sign != 0) return det_sign;

  det_sign = (c[0]*a[1] - c[1]*a[0]).sgn();     // db[2]
  if (det_sign != 0) return det_sign;
  det_sign = c[0].sgn();                        // db[2] * da[1]
  if (det_sign != 0) return det_sign;
  det_sign = -(c[1].sgn());                     // db[2] * da[0]
  if (det_sign != 0) return det_sign;
  det_sign = (c[2]*a[0] - c[0]*a[2]).sgn();     // db[1]
  if (det_sign != 0) return det_sign;
  det_sign = c[2].sgn();                        // db[1] * da[0]
  if (det_sign != 0) return det_sign;
  // The following test is listed in the paper, but it is redundant because
  // the previous tests guarantee that C == (0, 0, 0).
  S2_DCHECK_EQ(0, (c[1]*a[2] - c[2]*a[1]).sgn());  // db[0]

  det_sign = (a[0]*b[1] - a[1]*b[0]).sgn();     // dc[2]
  if (det_sign != 0) return det_sign;
  det_sign = -(b[0].sgn());                     // dc[2] * da[1]
  if (det_sign != 0) return det_sign;
  det_sign = b[1].sgn();                        // dc[2] * da[0]
  if (det_sign != 0) return det_sign;
  det_sign = a[0].sgn();                        // dc[2] * db[1]
  if (det_sign != 0) return det_sign;
  return 1;                                     // dc[2] * db[1] * da[0]
}